

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O3

bool __thiscall QTipLabel::tipChanged(QTipLabel *this,QPoint *pos,QString *text,QObject *o)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  int iVar8;
  undefined1 auVar7 [16];
  QStringView QVar9;
  QStringView QVar10;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::text(&local_50,&instance->super_QLabel);
  if (local_50.d.size == (text->d).size) {
    QVar9.m_data = local_50.d.ptr;
    QVar9.m_size = local_50.d.size;
    QVar10.m_data = (text->d).ptr;
    QVar10.m_size = local_50.d.size;
    bVar5 = QtPrivate::equalStrings(QVar9,QVar10);
  }
  else {
    bVar5 = 0;
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      local_50.d.d = (Data *)QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar6 = CONCAT71((int7)((ulong)local_50.d.d >> 8),1);
  if ((bVar5 & this->widget == (QWidget *)o) == 1) {
    uVar1 = (this->rect).x1;
    uVar3 = (this->rect).y1;
    uVar2 = (this->rect).x2;
    uVar4 = (this->rect).y2;
    auVar7._0_4_ = -(uint)(uVar2 == uVar1 + -1);
    iVar8 = -(uint)(uVar4 == uVar3 + -1);
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = iVar8;
    auVar7._12_4_ = iVar8;
    iVar8 = movmskpd((int)uVar6,auVar7);
    if (iVar8 == 3) {
      uVar6 = 0;
    }
    else {
      bVar5 = QRect::contains((QPoint *)&this->rect,SUB81(pos,0));
      uVar6 = (ulong)(bVar5 ^ 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB81(uVar6,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QTipLabel::tipChanged(const QPoint &pos, const QString &text, QObject *o)
{
    if (QTipLabel::instance->text() != text)
        return true;

    if (o != widget)
        return true;

    if (!rect.isNull())
        return !rect.contains(pos);
    else
       return false;
}